

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  bool bVar1;
  ulong uVar2;
  
  if (0 < this->length_) {
    uVar2 = this->length_ - 1;
    if (pos <= uVar2) {
      uVar2 = pos;
    }
    if (-1 < (long)uVar2) {
      do {
        if (this->ptr_[uVar2] == c) {
          return uVar2;
        }
        bVar1 = 0 < (long)uVar2;
        uVar2 = uVar2 - 1;
      } while (bVar1);
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(char c, size_type pos) const {
  // Note: memrchr() is not available on Windows.
  if (length_ <= 0) return npos;
  for (stringpiece_ssize_type i =
      std::min(pos, static_cast<size_type>(length_ - 1));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}